

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O3

void __thiscall wasm::Fuzzer::checkCanonicalization(Fuzzer *this)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  iterator __position;
  uint *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  Printed PVar4;
  undefined4 uVar5;
  mapped_type *this_00;
  undefined8 uVar6;
  uintptr_t uVar7;
  size_type __n;
  pointer pHVar8;
  ulong uVar9;
  Type TVar10;
  long *plVar11;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  Fatal *this_01;
  ostream *poVar12;
  uintptr_t uVar13;
  Type old;
  Type old_00;
  uintptr_t extraout_RDX;
  uintptr_t extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  char *pcVar14;
  Field *field;
  undefined8 *puVar15;
  byte bVar16;
  uint *puVar17;
  Index i;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  Signature SVar23;
  Array AVar24;
  undefined1 auVar25 [16];
  undefined1 in_stack_fffffffffffffc58 [32];
  _Manager_type in_stack_fffffffffffffc78;
  undefined1 auStack_378 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  undefined1 local_2d8 [8];
  Field *pFStack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [24];
  Printed local_148;
  long local_120;
  _Variadic_union<Copier::NewType,_Copier::OldType> local_118;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_110;
  TypeBuilder *local_108;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  uint local_b0;
  Printed local_a8;
  undefined1 local_80 [8];
  value_type type;
  byte local_68;
  undefined1 local_60 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newTypes;
  TypeBuilder local_38 [8];
  TypeBuilder builder;
  
  types = &this->types;
  wasm::TypeBuilder::TypeBuilder
            (local_38,(long)(this->types).
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->types).
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  local_118 = (_Variadic_union<Copier::NewType,_Copier::OldType>)&this->rand;
  local_100._M_buckets = &local_100._M_single_bucket;
  local_100._M_bucket_count = 1;
  local_100._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_100._M_element_count = 0;
  local_100._M_rehash_policy._M_max_load_factor = 1.0;
  local_100._M_rehash_policy._M_next_resize = 0;
  local_100._M_single_bucket = (__node_base_ptr)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_b0 = 0;
  pHVar8 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_110 = types;
  local_108 = local_38;
  newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish != pHVar8) {
    lVar20 = 0;
    uVar22 = 0;
    do {
      this_00 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_100,(key_type *)((long)&pHVar8->id + lVar20));
      local_2d8._0_4_ = (uint)uVar22;
      __position._M_current =
           (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,__position,(uint *)local_2d8);
      }
      else {
        *__position._M_current = (uint)uVar22;
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar22 = uVar22 + 1;
      pHVar8 = (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 8;
    } while (uVar22 < (ulong)((long)(local_110->
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3)
            );
  }
  uVar7 = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[4].id;
  uVar13 = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage[5].id;
  if (uVar13 != uVar7) {
    uVar22 = 0;
    do {
      puVar17 = *(uint **)(uVar7 + uVar22 * 0x18);
      puVar1 = *(uint **)(uVar7 + 8 + uVar22 * 0x18);
      if (puVar17 != puVar1) {
        do {
          uVar19 = *puVar17;
          if (uVar22 != uVar19) {
            uVar6 = wasm::TypeBuilder::getTempHeapType((ulong)local_38);
            wasm::TypeBuilder::setSubType(local_38,(ulong)uVar19,uVar6,1);
          }
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar1);
        uVar7 = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage[4].id;
        uVar13 = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage[5].id;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (ulong)(((long)(uVar13 - uVar7) >> 3) * -0x5555555555555555));
    pHVar8 = (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
             _M_impl.super__Vector_impl_data._M_start;
  }
  if ((local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar8) {
    uVar22 = 0;
    do {
      wasm::HeapType::isOpen();
      wasm::TypeBuilder::setOpen((ulong)local_38,SUB81(uVar22,0));
      wasm::HeapType::getShared();
      wasm::TypeBuilder::setShared((ulong)local_38,(Shareability)uVar22);
      uVar22 = uVar22 + 1;
    } while (uVar22 < (ulong)((long)(local_110->
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_110->
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  __n = wasm::TypeBuilder::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_c8,__n);
  if ((local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar22 = 0;
  }
  else {
    uVar9 = 0;
    bVar16 = 0;
    uVar22 = 0;
    do {
      lVar20 = wasm::HeapType::getRecGroup();
      uVar19 = (uint)uVar9;
      if ((!(bool)(bVar16 & lVar20 == local_120)) ||
         (pHVar8 = (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start, pHVar8[uVar9].id == pHVar8[uVar22].id))
      {
        local_2d8._0_4_ = uVar19;
        wasm::TypeBuilder::createRecGroup((ulong)local_38,uVar22);
        if ((uint)uVar22 < uVar19) {
          do {
            if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                (uint *)CONCAT44(local_c8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 local_c8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)local_2d8);
            }
            else {
              *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)uVar9;
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar18 = (int)uVar22 + 1;
            uVar22 = (ulong)uVar18;
            uVar9 = (ulong)local_2d8 & 0xffffffff;
          } while (uVar18 < (uint)local_2d8._0_4_);
        }
        pHVar8 = (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar22 = uVar9;
        local_120 = lVar20;
      }
      uVar9 = (ulong)(uVar19 + 1);
      bVar16 = 1;
    } while (uVar9 < (ulong)((long)(local_110->
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3))
    ;
  }
  uVar9 = wasm::TypeBuilder::size();
  local_2d8._0_4_ = (uint)uVar9;
  wasm::TypeBuilder::createRecGroup((ulong)local_38,uVar22);
  if ((uint)uVar22 < (uint)uVar9) {
    do {
      if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (uint *)CONCAT44(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_2d8);
      }
      else {
        *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = (uint)uVar9;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar19 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar19;
      uVar9 = (ulong)local_2d8 & 0xffffffff;
    } while (uVar19 < (uint)local_2d8._0_4_);
  }
  uVar22 = (ulong)local_b0;
  pHVar8 = (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar22 < (ulong)((long)(local_110->
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3)) {
    do {
      local_80 = (undefined1  [8])pHVar8[uVar22].id;
      uVar5 = wasm::HeapType::getKind();
      switch(uVar5) {
      case 1:
        auVar25 = wasm::HeapType::getSignature();
        TVar10.id = (uintptr_t)
                    checkCanonicalization()::Copier::getType(wasm::Type_
                              ((CopiedType *)&local_118._M_first,auVar25._0_8_,auVar25._8_8_);
        checkCanonicalization()::Copier::getType(wasm::Type_
                  ((CopiedType *)&local_118._M_first,(void *)auVar25._8_8_,old);
        SVar23.params.id._4_4_ = 0;
        SVar23.params.id._0_4_ = local_b0;
        SVar23.results.id = TVar10.id;
        wasm::TypeBuilder::setHeapType((ulong)local_38,SVar23);
        break;
      case 2:
        plVar11 = (long *)wasm::HeapType::getStruct();
        local_2d8 = (undefined1  [8])0x0;
        pFStack_2d0 = (Field *)0x0;
        local_2c8[0]._M_allocated_capacity = (Field *)0x0;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_2d8,
                   plVar11[1] - *plVar11 >> 4);
        puVar2 = (undefined8 *)plVar11[1];
        TVar10.id = extraout_RDX;
        for (puVar15 = (undefined8 *)*plVar11; puVar15 != puVar2; puVar15 = puVar15 + 2) {
          pvVar3 = (void *)puVar15[1];
          local_148.typeID =
               (TypeID)checkCanonicalization()::Copier::getType(wasm::Type_
                                 ((CopiedType *)&local_118._M_first,(void *)*puVar15,TVar10);
          local_148.generateName.super__Function_base._M_functor._M_unused._M_object = pvVar3;
          if (pFStack_2d0 == (Field *)local_2c8[0]._0_8_) {
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_realloc_insert<wasm::Field>
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_2d8,
                       (iterator)pFStack_2d0,(Field *)&local_148);
            TVar10.id = extraout_RDX_01;
          }
          else {
            (pFStack_2d0->type).id = local_148.typeID;
            *(void **)&pFStack_2d0->packedType = pvVar3;
            pFStack_2d0 = pFStack_2d0 + 1;
            TVar10.id = extraout_RDX_00;
          }
        }
        auStack_378 = local_2d8;
        print.defaultGenerator.funcCount = (size_t)pFStack_2d0;
        print.defaultGenerator.contCount = local_2c8[0]._M_allocated_capacity;
        wasm::TypeBuilder::setHeapType((ulong)local_38,(Struct *)(ulong)local_b0);
        if (auStack_378 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_378,print.defaultGenerator.contCount - (long)auStack_378);
        }
        break;
      case 3:
        wasm::HeapType::getArray();
        local_2d8 = (undefined1  [8])
                    checkCanonicalization()::Copier::getType(wasm::Type_
                              ((CopiedType *)&local_118._M_first,(void *)local_a8.typeID,old_00);
        pFStack_2d0 = (Field *)local_a8.generateName.super__Function_base._M_functor._M_unused._0_8_
        ;
        AVar24.element.type.id._4_4_ = 0;
        AVar24.element.type.id._0_4_ = local_b0;
        AVar24.element._8_8_ = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_2d8;
        local_a8.typeID = (TypeID)local_2d8;
        wasm::TypeBuilder::setHeapType((ulong)local_38,AVar24);
        break;
      case 4:
        uVar19 = 0x137;
        pcVar14 = "TODO: cont";
        goto LAB_00188581;
      default:
        uVar19 = 0x13b;
        pcVar14 = "unexpected type kind";
LAB_00188581:
        wasm::handle_unreachable
                  (pcVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp"
                   ,uVar19);
      }
      local_b0 = local_b0 + 1;
      uVar22 = (ulong)local_b0;
      pHVar8 = (local_110->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar22 < (ulong)((long)(local_110->
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3)
            );
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_100);
  wasm::TypeBuilder::build();
  if (local_68 == 1) {
    local_2d8 = (undefined1  [8])local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"");
    IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_378,types,
               (DefaultTypeNameGenerator *)auStack_378,(string *)local_2d8);
    if (local_2d8 != (undefined1  [8])local_2c8) {
      operator_delete((void *)local_2d8,(ulong)(local_2c8[0]._M_allocated_capacity + 1));
    }
    Fatal::Fatal((Fatal *)local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8[0]._M_local_buf,"Failed to build copies of the types: ",0x25);
    wasm::operator<<((ostream *)local_2c8[0]._M_local_buf,(ErrorReason)type.id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8[0]._M_local_buf," at index ",10);
    Fatal::operator<<((Fatal *)local_2d8,(unsigned_long *)local_80);
LAB_001887b6:
    Fatal::~Fatal((Fatal *)local_2d8);
  }
  __x = std::
        get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                  ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    *)local_80);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_60,__x);
  uVar7 = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1].id;
  lVar20 = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage[2].id - uVar7;
  if (lVar20 != (long)newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)local_60) {
    __assert_fail("types.size() == newTypes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp"
                  ,0x1d2,"void wasm::Fuzzer::checkCanonicalization()");
  }
  if (newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[2].id == uVar7) {
    if (local_60 == (undefined1  [8])0x0) goto LAB_001883b3;
  }
  else {
    lVar20 = lVar20 >> 3;
    lVar21 = 0;
    do {
      if (*(uintptr_t *)(uVar7 + lVar21 * 8) != ((pointer)((long)local_60 + lVar21 * 8))->id) {
        local_2d8 = (undefined1  [8])local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"");
        IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
        IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                  ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_378,types,
                   (DefaultTypeNameGenerator *)auStack_378,(string *)local_2d8);
        if (local_2d8 != (undefined1  [8])local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8[0]._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        if ((undefined1  [8])
            newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start != local_60) {
          uVar22 = 0;
          do {
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
            TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
            operator()((Printed *)&stack0xfffffffffffffc60,
                       (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                        *)auStack_378,(HeapType)((pointer)((long)local_60 + uVar22 * 8))->id);
            PVar4.generateName._M_invoker = (_Invoker_type)in_stack_fffffffffffffc78;
            PVar4.typeID = in_stack_fffffffffffffc58._0_8_;
            PVar4.generateName.super__Function_base._M_functor =
                 (_Any_data)SUB2416(in_stack_fffffffffffffc58._8_24_,0);
            PVar4.generateName.super__Function_base._M_manager =
                 (_Manager_type)SUB248(in_stack_fffffffffffffc58._8_24_,0x10);
            poVar12 = (ostream *)wasm::operator<<(poVar12,PVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if (in_stack_fffffffffffffc78 != (_Manager_type)0x0) {
              (*in_stack_fffffffffffffc78)
                        ((_Any_data *)&stack0xfffffffffffffc68,(_Any_data *)&stack0xfffffffffffffc68
                         ,__destroy_functor);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)((long)newTypes.
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_start - (long)local_60
                                   >> 3));
        }
        Fatal::Fatal((Fatal *)local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2c8[0]._M_local_buf,"Copy of type at index ",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2c8[0]._M_local_buf," is distinct:\n",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2c8[0]._M_local_buf,"original: ",10);
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
        operator()(&local_148,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                    *)auStack_378,
                   (HeapType)
                   (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar21].id);
        this_01 = Fatal::operator<<((Fatal *)local_2d8,&local_148);
        local_a8.typeID = CONCAT71(local_a8.typeID._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this_01->field_0x10,(char *)&local_a8,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this_01->field_0x10,"copy:     ",10);
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
        operator()(&local_a8,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                    *)auStack_378,(HeapType)((pointer)((long)local_60 + lVar21 * 8))->id);
        Fatal::operator<<(this_01,&local_a8);
        HeapType::Printed::~Printed(&local_a8);
        HeapType::Printed::~Printed(&local_148);
        goto LAB_001887b6;
      }
      lVar21 = lVar21 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar21);
  }
  operator_delete((void *)local_60,
                  (long)newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_60);
LAB_001883b3:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_68]._M_data)
            ((anon_class_1_0_00000001 *)local_2d8,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_80);
  wasm::TypeBuilder::~TypeBuilder(local_38);
  return;
}

Assistant:

void Fuzzer::checkCanonicalization() {
  // Check that structural canonicalization is working correctly by building the
  // types again, choosing randomly between equivalent possible children for
  // each definition from both the new and old sets of built types.
  TypeBuilder builder(types.size());

  // Helper for creating new definitions of existing types, randomly choosing
  // between canonical and temporary components.
  struct Copier {
    Random& rand;
    const std::vector<HeapType>& types;
    TypeBuilder& builder;

    // For each type, the indices in `types` at which it appears.
    std::unordered_map<HeapType, std::vector<Index>> typeIndices;

    // For each type, the index one past the end of its rec group, or
    // alternatively the cumulative size of its rec group and previous rec
    // groups.
    std::vector<Index> recGroupEnds;

    // The index of the type we are currently building.
    Index index = 0;

    Copier(Fuzzer& parent, TypeBuilder& builder)
      : rand(parent.rand), types(parent.types), builder(builder) {
      // Set the type indices
      for (size_t i = 0; i < types.size(); ++i) {
        typeIndices[types[i]].push_back(i);
      }

      // Set supertypes
      // TODO: support setting old canonical types as the supertypes.
      const auto& subtypeIndices = parent.subtypeIndices;
      for (size_t super = 0; super < subtypeIndices.size(); ++super) {
        for (auto sub : subtypeIndices[super]) {
          if (sub != super) {
            builder[sub].subTypeOf(builder[super]);
          }
        }
      }

      // Set finality and shareability
      for (size_t i = 0; i < types.size(); ++i) {
        builder[i].setOpen(types[i].isOpen());
        builder[i].setShared(types[i].getShared());
      }

      // Set up recursion groups and record group ends to ensure we only select
      // valid children.
      recGroupEnds.reserve(builder.size());
      // Set up recursion groups
      std::optional<RecGroup> currGroup;
      size_t currGroupStart = 0;
      auto finishGroup = [&](Index end) {
        builder.createRecGroup(currGroupStart, end - currGroupStart);
        for (Index i = currGroupStart; i < end; ++i) {
          recGroupEnds.push_back(end);
        }
        currGroupStart = end;
      };
      for (Index i = 0; i < types.size(); ++i) {
        auto newGroup = types[i].getRecGroup();
        if (!currGroup || newGroup != currGroup ||
            types[i] == types[currGroupStart]) {
          finishGroup(i);
          currGroup = newGroup;
        }
      }
      finishGroup(builder.size());

      // Copy the original types
      for (; index < types.size(); ++index) {
        auto type = types[index];
        switch (type.getKind()) {
          case HeapTypeKind::Func:
            builder[index] = getSignature(type.getSignature());
            continue;
          case HeapTypeKind::Struct:
            builder[index] = getStruct(type.getStruct());
            continue;
          case HeapTypeKind::Array:
            builder[index] = getArray(type.getArray());
            continue;
          case HeapTypeKind::Cont:
            WASM_UNREACHABLE("TODO: cont");
          case HeapTypeKind::Basic:
            break;
        }
        WASM_UNREACHABLE("unexpected type kind");
      }
    }

    struct NewHeapType : HeapType {};
    struct OldHeapType : HeapType {};
    struct CopiedHeapType {
      std::variant<NewHeapType, OldHeapType> type;
      NewHeapType* getNew() { return std::get_if<NewHeapType>(&type); }
      OldHeapType* getOld() { return std::get_if<OldHeapType>(&type); }
      HeapType get() {
        return getNew() ? HeapType(*getNew()) : HeapType(*getOld());
      }
    };

    struct NewType : Type {};
    struct OldType : Type {};
    struct CopiedType {
      std::variant<NewType, OldType> type;
      NewType* getNew() { return std::get_if<NewType>(&type); }
      OldType* getOld() { return std::get_if<OldType>(&type); }
      Type get() { return getNew() ? Type(*getNew()) : Type(*getOld()); }
    };

    CopiedHeapType getChildHeapType(HeapType old) {
      auto it = typeIndices.find(old);
      if (it == typeIndices.end()) {
        // This is a basic heap type and wasn't explicitly built.
        assert(old.isBasic());
        return {OldHeapType{old}};
      }
      assert(!old.isBasic());
      // Check whether this child heap type is supposed to be a self-reference
      // into the recursion group we are defining. If it is, we must use the
      // corresponding type in the new recursion group, since anything else
      // would break isorecursive equivalence.
      auto group = old.getRecGroup();
      if (group == types[index].getRecGroup()) {
        // This is a self-reference, so find the correct index, which is the
        // last matching index less than the end of this rec group.
        std::optional<Index> i;
        for (auto candidate : it->second) {
          if (candidate >= recGroupEnds[index]) {
            break;
          }
          i = candidate;
        }
        return {NewHeapType{builder[*i]}};
      }
      // Choose whether to use an old type or a new type
      if (rand.oneIn(2)) {
        // Using a copied heap type; filter out invalid candidates.
        // Filter out invalid candidates.
        std::vector<Index> candidateIndices;
        for (auto i : it->second) {
          if (i < recGroupEnds[index]) {
            candidateIndices.push_back(i);
          }
        }
        assert(!candidateIndices.empty());
        Index i = rand.pick(candidateIndices);
        return {NewHeapType{builder[i]}};
      } else {
        // Using an original heap type.
        Index i = rand.pick(it->second);
        return {OldHeapType{types[i]}};
      }
    }

    CopiedType getTuple(Type old) {
      TypeList types;
      types.reserve(old.size());
      bool hasTempChild = false;
      for (auto type : old) {
        auto copied = getType(type);
        if (copied.getNew()) {
          hasTempChild = true;
        }
        types.push_back(copied.get());
      }
      // Must use a temporary type if we have a temporary child, otherwise we
      // can choose.
      if (hasTempChild || rand.oneIn(2)) {
        return {NewType{builder.getTempTupleType(types)}};
      } else {
        return {OldType{Tuple(std::move(types))}};
      }
    }

    CopiedType getRef(Type old) {
      auto copied = getChildHeapType(old.getHeapType());
      auto type = copied.get();
      auto nullability = old.getNullability();
      if (copied.getNew()) {
        // The child is temporary, so we must put it in a temporary type.
        return {NewType{builder.getTempRefType(type, nullability)}};
      } else {
        // The child is canonical, so we can either put it in a temporary type
        // or use the canonical type.
        if (rand.oneIn(2)) {
          return {NewType{builder.getTempRefType(type, nullability)}};
        } else {
          return {OldType{Type(type, nullability)}};
        }
      }
    }

    CopiedType getType(Type old) {
      if (old.isTuple()) {
        return getTuple(old);
      } else if (old.isRef()) {
        return getRef(old);
      } else {
        assert(old.isBasic());
        return {OldType{old}};
      }
    }

    Field getField(Field old) {
      old.type = getType(old.type).get();
      return old;
    }

    Signature getSignature(Signature old) {
      return {getType(old.params).get(), getType(old.results).get()};
    }

    Struct getStruct(const Struct& old) {
      FieldList fields;
      fields.reserve(old.fields.size());
      for (const auto& field : old.fields) {
        fields.push_back(getField(field));
      }
      return {std::move(fields)};
    }

    Array getArray(Array old) {
      old.element = getField(old.element);
      return old;
    }
  };

  Copier{*this, builder};

  auto result = builder.build();
  if (auto* error = result.getError()) {
    IndexedTypeNameGenerator print(types);
    Fatal() << "Failed to build copies of the types: " << error->reason
            << " at index " << error->index;
  }
  auto newTypes = *result;
  assert(types.size() == newTypes.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (types[i] != newTypes[i]) {
      IndexedTypeNameGenerator print(types);
      std::cerr << "\n";
      for (size_t j = 0; j < newTypes.size(); ++j) {
        std::cerr << j << ": " << print(newTypes[j]) << "\n";
      }
      Fatal() << "Copy of type at index " << i << " is distinct:\n"
              << "original: " << print(types[i]) << '\n'
              << "copy:     " << print(newTypes[i]);
    }
  }
}